

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void duckdb::TemplatedWritePlain<unsigned_long,unsigned_long,duckdb::ParquetCastOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  long lVar1;
  _func_int **pp_Var2;
  long lVar3;
  NumericStatisticsState<unsigned_long,_unsigned_long,_duckdb::BaseParquetOperator> *numeric_stats;
  unsigned_long local_write [2048];
  ulong local_4038 [2049];
  
  if (chunk_start < chunk_end) {
    lVar1 = *(long *)(col + 0x20);
    lVar3 = 0;
    do {
      if ((*(long *)mask == 0) ||
         ((*(ulong *)(*(long *)mask + (chunk_start >> 6) * 8) >> (chunk_start & 0x3f) & 1) != 0)) {
        pp_Var2 = *(_func_int ***)(lVar1 + chunk_start * 8);
        if (pp_Var2 < stats[1]._vptr_ColumnWriterStatistics) {
          stats[1]._vptr_ColumnWriterStatistics = pp_Var2;
        }
        if (stats[2]._vptr_ColumnWriterStatistics < pp_Var2) {
          stats[2]._vptr_ColumnWriterStatistics = pp_Var2;
        }
        local_4038[lVar3] = (ulong)pp_Var2;
        lVar3 = lVar3 + 1;
        if (lVar3 == 0x800) {
          (*(code *)**(undefined8 **)ser)(ser,local_4038,0x4000);
          lVar3 = 0;
        }
      }
      chunk_start = chunk_start + 1;
    } while (chunk_end != chunk_start);
    lVar3 = lVar3 << 3;
  }
  else {
    lVar3 = 0;
  }
  (*(code *)**(undefined8 **)ser)(ser,local_4038,lVar3);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}